

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall CDBWrapper::ReadImpl_abi_cxx11_(CDBWrapper *this,Span<const_std::byte> key)

{
  DB *pDVar1;
  string_view logging_function;
  undefined1 uVar2;
  undefined1 uVar3;
  Status *status_00;
  LevelDBContext *this_00;
  LevelDBContext *pLVar4;
  char *in_RDX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  long in_FS_OFFSET;
  Level in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  Status status;
  Slice slKey;
  string strValue;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  char *in_stack_fffffffffffffee0;
  Slice *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff4c;
  ConstevalFormatString<1U> in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  Slice local_48 [2];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Span<const_std::byte>::data
            ((Span<const_std::byte> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
  ;
  status_00 = (Status *)
              CharCast((byte *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  Span<const_std::byte>::size
            ((Span<const_std::byte> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
  ;
  leveldb::Slice::Slice
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::__cxx11::string::string(in_stack_fffffffffffffef0);
  this_00 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  pDVar1 = this_00->pdb;
  pLVar4 = DBContext((CDBWrapper *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  (*pDVar1->_vptr_DB[5])
            (&stack0xffffffffffffff90,pDVar1,&pLVar4->readoptions,&stack0xffffffffffffff98,local_28)
  ;
  uVar2 = leveldb::Status::ok((Status *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (!(bool)uVar2) {
    uVar3 = leveldb::Status::IsNotFound
                      ((Status *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if ((bool)uVar3) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(in_RDI);
      goto LAB_008ceb77;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffef8)),
               (char *)in_stack_fffffffffffffef0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffef8)),
               (char *)in_stack_fffffffffffffef0);
    in_stack_fffffffffffffee0 = "LevelDB read failure: %s\n";
    leveldb::Status::ToString_abi_cxx11_((Status *)this_00);
    in_stack_fffffffffffffee8 = local_48;
    in_stack_fffffffffffffed8 = 2;
    logging_function._M_str = in_RDX;
    logging_function._M_len = in_stack_ffffffffffffffa0;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,in_stack_ffffffffffffff90,in_stack_ffffffffffffff4c,
               (LogFlags)in_stack_fffffffffffffee0,in_stack_00000080,in_stack_ffffffffffffff88,
               in_stack_00000090);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    HandleError(status_00);
  }
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0);
LAB_008ceb77:
  leveldb::Status::~Status((Status *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> CDBWrapper::ReadImpl(Span<const std::byte> key) const
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());
    std::string strValue;
    leveldb::Status status = DBContext().pdb->Get(DBContext().readoptions, slKey, &strValue);
    if (!status.ok()) {
        if (status.IsNotFound())
            return std::nullopt;
        LogPrintf("LevelDB read failure: %s\n", status.ToString());
        HandleError(status);
    }
    return strValue;
}